

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb__splitpath_raw(char *buffer,char *path,int flag)

{
  size_t sVar1;
  int local_60;
  int local_58;
  char *local_50;
  char *t;
  char *s;
  int f2;
  int f1;
  int n;
  int y;
  int x;
  int len;
  int flag_local;
  char *path_local;
  char *buffer_local;
  
  y = 0;
  sVar1 = strlen(path);
  f1 = (int)sVar1;
  t = stb_strrchr2(path,'/','\\');
  local_50 = strrchr(path,0x2e);
  if (((t != (char *)0x0) && (local_50 != (char *)0x0)) && (local_50 < t)) {
    local_50 = (char *)0x0;
  }
  if (t != (char *)0x0) {
    t = t + 1;
  }
  x = flag;
  if (flag == 8) {
    x = 0xc;
  }
  if ((x & 7U) == 0) {
    buffer_local = (char *)0x0;
  }
  else {
    if (t == (char *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = (int)t - (int)path;
    }
    local_60 = f1;
    if (local_50 != (char *)0x0) {
      local_60 = (int)local_50 - (int)path;
    }
    if ((x & 1U) == 0) {
      n = local_58;
      if ((((x & 2U) == 0) && (n = local_60, (x & 8U) != 0)) && (buffer[local_60] == '.')) {
        n = local_60 + 1;
      }
    }
    else {
      n = 0;
      if ((local_58 == 0) && (x == 1)) {
        y = 2;
      }
    }
    if (((x & 4U) == 0) && (f1 = local_58, (x & 2U) != 0)) {
      f1 = local_60;
    }
    path_local = buffer;
    if ((buffer == (char *)0x0) &&
       (path_local = (char *)malloc((long)((f1 - n) + y + 1)), path_local == (char *)0x0)) {
      buffer_local = (char *)0x0;
    }
    else if (y == 0) {
      strncpy(path_local,path + n,(long)(f1 - n));
      path_local[f1 - n] = '\0';
      buffer_local = path_local;
    }
    else {
      strcpy(path_local,"./");
      buffer_local = path_local;
    }
  }
  return buffer_local;
}

Assistant:

static char *stb__splitpath_raw(char *buffer, char *path, int flag)
{
   int len=0,x,y, n = (int) strlen(path), f1,f2;
   char *s = stb_strrchr2(path, '/', '\\');
   char *t = strrchr(path, '.');
   if (s && t && t < s) t = NULL;
   if (s) ++s;

   if (flag == STB_EXT_NO_PERIOD)
      flag |= STB_EXT;

   if (!(flag & (STB_PATH | STB_FILE | STB_EXT))) return NULL;

   f1 = s == NULL ? 0 : s-path; // start of filename
   f2 = t == NULL ? n : t-path; // just past end of filename

   if (flag & STB_PATH) {
      x = 0; if (f1 == 0 && flag == STB_PATH) len=2;
   } else if (flag & STB_FILE) {
      x = f1;
   } else {
      x = f2;
      if (flag & STB_EXT_NO_PERIOD)
         if (buffer[x] == '.')
            ++x;
   }

   if (flag & STB_EXT)
      y = n;
   else if (flag & STB_FILE)
      y = f2;
   else
      y = f1;

   if (buffer == NULL) {
      buffer = (char *) malloc(y-x + len + 1);
      if (!buffer) return NULL;
   }

   if (len) { strcpy(buffer, "./"); return buffer; }
   strncpy(buffer, path+x, y-x);
   buffer[y-x] = 0;
   return buffer;
}